

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum.pb.cc
# Opt level: O2

void __thiscall proto3_preserve_unknown_enum_unittest::MyMessage::Clear(MyMessage *this)

{
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_e_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_packed_e_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_packed_unexpected_e_)
  ;
  (this->field_0)._impl_.e_ = 0;
  (this->field_0)._impl_._oneof_case_[0] = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void MyMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:proto3_preserve_unknown_enum_unittest.MyMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_e_.Clear();
  _impl_.repeated_packed_e_.Clear();
  _impl_.repeated_packed_unexpected_e_.Clear();
  _impl_.e_ = 0;
  clear_o();
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}